

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBase32.cxx
# Opt level: O2

void Base32Encode5(uchar *src,char *dst)

{
  *dst = "ABCDEFGHIJKLMNOPQRSTUVWXYZ234567"[*src >> 3];
  dst[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZ234567"[(uint)(src[1] >> 6) + (*src & 7) * 4];
  dst[2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZ234567"[src[1] >> 1 & 0x1f];
  dst[3] = "ABCDEFGHIJKLMNOPQRSTUVWXYZ234567"[(uint)(src[2] >> 4) | (src[1] & 1) << 4];
  dst[4] = "ABCDEFGHIJKLMNOPQRSTUVWXYZ234567"[(uint)(src[3] >> 7) + (src[2] & 0xf) * 2];
  dst[5] = "ABCDEFGHIJKLMNOPQRSTUVWXYZ234567"[src[3] >> 2 & 0x1f];
  dst[6] = "ABCDEFGHIJKLMNOPQRSTUVWXYZ234567"[(uint)(src[4] >> 5) + (src[3] & 3) * 8];
  dst[7] = "ABCDEFGHIJKLMNOPQRSTUVWXYZ234567"[src[4] & 0x1f];
  return;
}

Assistant:

void Base32Encode5(const unsigned char src[5], char dst[8])
{
  // [0]:5 bits
  dst[0] = Base32EncodeChar((src[0] >> 3) & 0x1F);
  // [0]:3 bits + [1]:2 bits
  dst[1] = Base32EncodeChar(((src[0] << 2) & 0x1C) + ((src[1] >> 6) & 0x03));
  // [1]:5 bits
  dst[2] = Base32EncodeChar((src[1] >> 1) & 0x1F);
  // [1]:1 bit + [2]:4 bits
  dst[3] = Base32EncodeChar(((src[1] << 4) & 0x10) + ((src[2] >> 4) & 0x0F));
  // [2]:4 bits + [3]:1 bit
  dst[4] = Base32EncodeChar(((src[2] << 1) & 0x1E) + ((src[3] >> 7) & 0x01));
  // [3]:5 bits
  dst[5] = Base32EncodeChar((src[3] >> 2) & 0x1F);
  // [3]:2 bits + [4]:3 bit
  dst[6] = Base32EncodeChar(((src[3] << 3) & 0x18) + ((src[4] >> 5) & 0x07));
  // [4]:5 bits
  dst[7] = Base32EncodeChar((src[4] << 0) & 0x1F);
}